

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O1

void __thiscall
Fl_Xlib_Graphics_Driver::rtl_draw(Fl_Xlib_Graphics_Driver *this,char *c,int n,int x,int y)

{
  if (font_gc != fl_gc) {
    if ((this->super_Fl_Graphics_Driver).font_descriptor_ == (Fl_Font_Descriptor *)0x0) {
      (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
                (this,0,(ulong)(uint)FL_NORMAL_SIZE);
    }
    font_gc = fl_gc;
  }
  if (fl_gc != (GC)0x0) {
    XUtf8DrawRtlString(fl_display,fl_window,
                       ((this->super_Fl_Graphics_Driver).font_descriptor_)->font,fl_gc,x,y,c,n);
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::rtl_draw(const char* c, int n, int x, int y) {
  if (font_gc != fl_gc) {
    if (!font_descriptor()) this->font(FL_HELVETICA, FL_NORMAL_SIZE);
    font_gc = fl_gc;
  }
  if (fl_gc) XUtf8DrawRtlString(fl_display, fl_window, font_descriptor()->font, fl_gc, x, y, c, n);
}